

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool_test.cpp
# Opt level: O0

void __thiscall TimeAlloc::~TimeAlloc(TimeAlloc *this)

{
  time_t tVar1;
  ostream *poVar2;
  int local_18;
  time_t endTime;
  TimeAlloc *this_local;
  
  tVar1 = time((time_t *)0x0);
  poVar2 = std::operator<<((ostream *)&std::cout,"time, ");
  local_18 = (int)tVar1;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18 - (int)this->m_startTime);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"cnt, ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,globalCnt);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

~TimeAlloc()
	{
		time_t endTime = time(NULL);
		cout << "time, " << (unsigned int)(endTime - m_startTime) << endl;
		cout << "cnt, " << globalCnt << endl;
	}